

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,Value *value,bool decl)

{
  FILE *__stream;
  ValueKind VVar1;
  Argument *arg;
  AllocaInst *alloca;
  StoreInst *ptr;
  BasicBlock *bb;
  BranchInst *br;
  AtomicCmpXchgInst *xchg;
  CallInst *call;
  ShuffleVectorInst *shuf;
  AtomicRMWInst *atomic_op;
  ICmpInst *value_00;
  GetElementPtrInst *ptr_00;
  ConstantInt *value_01;
  ExtractElementInst *extr;
  ConstantDataArray *arr;
  FCmpInst *value_02;
  LoggingCallback p_Var2;
  void *pvVar3;
  ReturnInst *value_03;
  Function *func;
  ConstantDataVector *vec;
  UndefValue *undef;
  PHINode *phi;
  CastInst *cast;
  InsertElementInst *inst;
  ConstantFP *value_04;
  BinaryOperator *binop;
  UnaryOperator *uop;
  ExtractValueInst *ext;
  SelectInst *cast_00;
  LoadInst *ptr_01;
  GlobalVariable *var;
  SwitchInst *branch;
  char buffer [4096];
  
  VVar1 = Value::get_value_kind(value);
  switch(VVar1) {
  case Argument:
    arg = cast<LLVMBC::Argument>(value);
    append(this,arg,false);
    return;
  case Function:
    func = cast<LLVMBC::Function>(value);
    append(this,func,decl);
    return;
  case ConstantInt:
    value_01 = cast<LLVMBC::ConstantInt>(value);
    append(this,value_01,false);
    return;
  case ConstantFP:
    value_04 = cast<LLVMBC::ConstantFP>(value);
    append(this,value_04,false);
    return;
  case ConstantAggregateZero:
    cast<LLVMBC::ConstantAggregateZero>(value);
    std::operator<<((ostream *)this,"[zeroinitialized]");
    return;
  case ConstantDataArray:
    arr = cast<LLVMBC::ConstantDataArray>(value);
    append(this,arr,false);
    return;
  case ConstantDataVector:
    vec = cast<LLVMBC::ConstantDataVector>(value);
    append(this,vec,false);
    return;
  case Undef:
    undef = cast<LLVMBC::UndefValue>(value);
    append(this,undef,false);
    return;
  case UnaryOperator:
    uop = cast<LLVMBC::UnaryOperator>(value);
    append(this,uop,decl);
    return;
  case BinaryOperator:
    binop = cast<LLVMBC::BinaryOperator>(value);
    append(this,binop,decl);
    return;
  case Call:
    call = cast<LLVMBC::CallInst>(value);
    append(this,call,decl);
    return;
  case FCmp:
    value_02 = cast<LLVMBC::FCmpInst>(value);
    append(this,value_02,decl);
    return;
  case ICmp:
    value_00 = cast<LLVMBC::ICmpInst>(value);
    append(this,value_00,decl);
    return;
  case BasicBlock:
    bb = cast<LLVMBC::BasicBlock>(value);
    append(this,bb,decl);
    return;
  case PHI:
    phi = cast<LLVMBC::PHINode>(value);
    append(this,phi,decl);
    return;
  case Cast:
    cast = cast<LLVMBC::CastInst>(value);
    append(this,cast,decl);
    return;
  case Select:
    cast_00 = cast<LLVMBC::SelectInst>(value);
    append(this,cast_00,decl);
    return;
  case ExtractValue:
    ext = cast<LLVMBC::ExtractValueInst>(value);
    append(this,ext,decl);
    return;
  case Alloca:
    alloca = cast<LLVMBC::AllocaInst>(value);
    append(this,alloca,decl);
    return;
  case GetElementPtr:
    ptr_00 = cast<LLVMBC::GetElementPtrInst>(value);
    append(this,ptr_00,decl);
    return;
  case Load:
    ptr_01 = cast<LLVMBC::LoadInst>(value);
    append(this,ptr_01,decl);
    return;
  case Store:
    ptr = cast<LLVMBC::StoreInst>(value);
    append(this,ptr,decl);
    return;
  case AtomicRMW:
    atomic_op = cast<LLVMBC::AtomicRMWInst>(value);
    append(this,atomic_op,decl);
    return;
  case AtomicCmpXchg:
    xchg = cast<LLVMBC::AtomicCmpXchgInst>(value);
    append(this,xchg,decl);
    return;
  case Return:
    value_03 = cast<LLVMBC::ReturnInst>(value);
    append(this,value_03,false);
    return;
  case Branch:
    br = cast<LLVMBC::BranchInst>(value);
    append(this,br,false);
    return;
  case Switch:
    branch = cast<LLVMBC::SwitchInst>(value);
    append(this,branch,false);
    return;
  case Global:
    var = cast<LLVMBC::GlobalVariable>(value);
    append(this,var,decl);
    return;
  case ShuffleVector:
    shuf = cast<LLVMBC::ShuffleVectorInst>(value);
    append(this,shuf,decl);
    return;
  case ExtractElement:
    extr = cast<LLVMBC::ExtractElementInst>(value);
    append(this,extr,decl);
    return;
  case InsertElement:
    inst = cast<LLVMBC::InsertElementInst>(value);
    append(this,inst,decl);
    return;
  }
  p_Var2 = dxil_spv::get_thread_log_callback();
  __stream = _stderr;
  if (p_Var2 == (LoggingCallback)0x0) {
    VVar1 = Value::get_value_kind(value);
    fprintf(__stream,"[ERROR]: Unknown ValueKind %u.\n",(ulong)VVar1);
    fflush(_stderr);
  }
  else {
    VVar1 = Value::get_value_kind(value);
    snprintf(buffer,0x1000,"Unknown ValueKind %u.\n",(ulong)VVar1);
    pvVar3 = dxil_spv::get_thread_log_callback_userdata();
    (*p_Var2)(pvVar3,Error,buffer);
  }
  if (decl) {
    buffer._0_8_ = Value::get_tween_id(value);
    append<char_const(&)[2],unsigned_long,char_const(&)[17]>
              (this,(char (*) [2])0x1a7902,(unsigned_long *)buffer,(char (*) [17])" = unimplemented"
              );
  }
  else {
    buffer._0_8_ = Value::get_tween_id(value);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1a7902,(unsigned_long *)buffer);
  }
  return;
}

Assistant:

void StreamState::append(Value *value, bool decl)
{
	switch (value->get_value_kind())
	{
	case ValueKind::Argument:
		return append(cast<Argument>(value), decl);
	case ValueKind::Function:
		return append(cast<Function>(value), decl);
	case ValueKind::BinaryOperator:
		return append(cast<BinaryOperator>(value), decl);
	case ValueKind::UnaryOperator:
		return append(cast<UnaryOperator>(value), decl);
	case ValueKind::Call:
		return append(cast<CallInst>(value), decl);
	case ValueKind::Branch:
		return append(cast<BranchInst>(value), decl);
	case ValueKind::FCmp:
		return append(cast<FCmpInst>(value), decl);
	case ValueKind::ICmp:
		return append(cast<ICmpInst>(value), decl);
	case ValueKind::Return:
		return append(cast<ReturnInst>(value), decl);
	case ValueKind::Undef:
		return append(cast<UndefValue>(value), decl);
	case ValueKind::ConstantInt:
		return append(cast<ConstantInt>(value), decl);
	case ValueKind::ConstantFP:
		return append(cast<ConstantFP>(value), decl);
	case ValueKind::BasicBlock:
		return append(cast<BasicBlock>(value), decl);
	case ValueKind::PHI:
		return append(cast<PHINode>(value), decl);
	case ValueKind::Cast:
		return append(cast<CastInst>(value), decl);
	case ValueKind::Select:
		return append(cast<SelectInst>(value), decl);
	case ValueKind::ExtractValue:
		return append(cast<ExtractValueInst>(value), decl);
	case ValueKind::Alloca:
		return append(cast<AllocaInst>(value), decl);
	case ValueKind::GetElementPtr:
		return append(cast<GetElementPtrInst>(value), decl);
	case ValueKind::Load:
		return append(cast<LoadInst>(value), decl);
	case ValueKind::Store:
		return append(cast<StoreInst>(value), decl);
	case ValueKind::AtomicRMW:
		return append(cast<AtomicRMWInst>(value), decl);
	case ValueKind::AtomicCmpXchg:
		return append(cast<AtomicCmpXchgInst>(value), decl);
	case ValueKind::Global:
		return append(cast<GlobalVariable>(value), decl);
	case ValueKind::ConstantAggregateZero:
		return append(cast<ConstantAggregateZero>(value), decl);
	case ValueKind::ConstantDataArray:
		return append(cast<ConstantDataArray>(value), decl);
	case ValueKind::ConstantDataVector:
		return append(cast<ConstantDataVector>(value), decl);
	case ValueKind::Switch:
		return append(cast<SwitchInst>(value), decl);
	case ValueKind::ShuffleVector:
		return append(cast<ShuffleVectorInst>(value), decl);
	case ValueKind::ExtractElement:
		return append(cast<ExtractElementInst>(value), decl);
	case ValueKind::InsertElement:
		return append(cast<InsertElementInst>(value), decl);
	default:
		break;
	}

	LOGE("Unknown ValueKind %u.\n", unsigned(value->get_value_kind()));

	if (decl)
		append("%", value->get_tween_id(), " = unimplemented");
	else
		append("%", value->get_tween_id());
}